

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::DisconnectNode(CConnman *this,CNetAddr *addr)

{
  bool bVar1;
  long in_FS_OFFSET;
  CSubNet local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(&local_50,addr);
  bVar1 = DisconnectNode(this,&local_50);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CNetAddr& addr)
{
    return DisconnectNode(CSubNet(addr));
}